

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::NonMaximumSuppression::MergePartialFromCodedStream
          (NonMaximumSuppression *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  ArenaStringPtr *this_04;
  ArenaStringPtr *this_05;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  double *pdVar4;
  uint8 *puVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint32 uVar9;
  Int64Vector *this_06;
  NonMaximumSuppression_PickTop *this_07;
  StringVector *this_08;
  pair<int,_int> pVar10;
  char *field_name;
  char cVar11;
  ulong uVar12;
  string *psVar13;
  pointer data;
  double dVar14;
  double local_38;
  
  this_00 = &this->coordinatesoutputfeaturename_;
  this_01 = &this->confidenceoutputfeaturename_;
  this_02 = &this->confidencethresholdinputfeaturename_;
  this_03 = &this->iouthresholdinputfeaturename_;
  this_04 = &this->coordinatesinputfeaturename_;
  this_05 = &this->confidenceinputfeaturename_;
LAB_004bea8a:
  pbVar3 = input->buffer_;
  uVar9 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar12 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar7 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar9 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar9 = uVar7, (~(uint)*pbVar1 & uVar7) < 0x80))
      goto LAB_004befd4;
      uVar12 = (ulong)((uVar7 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar12 = uVar12 | 0x100000000;
  }
  else {
LAB_004befd4:
    uVar9 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar9);
    uVar12 = 0;
    if (uVar9 - 1 < 0x3fff) {
      uVar12 = 0x100000000;
    }
    uVar12 = uVar9 | uVar12;
  }
  uVar9 = (uint32)uVar12;
  if ((uVar12 & 0x100000000) != 0) {
    uVar7 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar12;
    if (uVar7 < 0x6e) {
      if (uVar7 == 1) {
        if (cVar11 == '\n') {
          if (this->_oneof_case_[0] == 1) {
            this_07 = (this->SuppressionMethod_).picktop_;
          }
          else {
            this->_oneof_case_[0] = 1;
            this_07 = (NonMaximumSuppression_PickTop *)operator_new(0x18);
            NonMaximumSuppression_PickTop::NonMaximumSuppression_PickTop(this_07);
            (this->SuppressionMethod_).picktop_ = this_07;
          }
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
            input->buffer_ = puVar5 + 1;
          }
          else {
            iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar8 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar8);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar6 = NonMaximumSuppression_PickTop::MergePartialFromCodedStream(this_07,input);
          goto LAB_004befc0;
        }
        goto switchD_004beb36_caseD_cc;
      }
      if (uVar7 == 100) {
        if (cVar11 == '\"') {
          if (this->_oneof_case_[1] == 100) {
            this_08 = (this->ClassLabels_).stringclasslabels_;
          }
          else {
            clear_ClassLabels(this);
            this->_oneof_case_[1] = 100;
            this_08 = (StringVector *)operator_new(0x30);
            StringVector::StringVector(this_08);
            (this->ClassLabels_).stringclasslabels_ = this_08;
          }
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
            input->buffer_ = puVar5 + 1;
          }
          else {
            iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar8 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar8);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar6 = StringVector::MergePartialFromCodedStream(this_08,input);
          goto LAB_004befc0;
        }
        goto switchD_004beb36_caseD_cc;
      }
      if ((uVar7 != 0x65) || (cVar11 != '*')) goto switchD_004beb36_caseD_cc;
      if (this->_oneof_case_[1] == 0x65) {
        this_06 = (this->ClassLabels_).int64classlabels_;
      }
      else {
        clear_ClassLabels(this);
        this->_oneof_case_[1] = 0x65;
        this_06 = (Int64Vector *)operator_new(0x28);
        Int64Vector::Int64Vector(this_06);
        (this->ClassLabels_).int64classlabels_ = this_06;
      }
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
        input->buffer_ = puVar5 + 1;
      }
      else {
        iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar8);
      if ((long)pVar10 < 0) {
        return false;
      }
      bVar6 = Int64Vector::MergePartialFromCodedStream(this_06,input);
LAB_004befc0:
      if (bVar6 == false) {
        return false;
      }
      bVar6 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar10.first);
      goto LAB_004beb08;
    }
    switch(uVar7) {
    case 200:
      if (cVar11 != 'B') break;
      psVar13 = this_05->ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_05,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_05->ptr_;
      }
      bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar6) {
        return false;
      }
      data = (this_05->ptr_->_M_dataplus)._M_p;
      iVar8 = (int)this_05->ptr_->_M_string_length;
      field_name = "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName";
LAB_004bee1d:
      bVar6 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        (data,iVar8,PARSE,field_name);
      if (!bVar6) {
        return false;
      }
      goto LAB_004bea8a;
    case 0xc9:
      if (cVar11 == 'J') {
        psVar13 = this_04->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_04,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_04->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar6) {
          return false;
        }
        data = (this_04->ptr_->_M_dataplus)._M_p;
        iVar8 = (int)this_04->ptr_->_M_string_length;
        field_name = "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName";
        goto LAB_004bee1d;
      }
      break;
    case 0xca:
      if (cVar11 == 'R') {
        psVar13 = this_03->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_03,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_03->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar6) {
          return false;
        }
        data = (this_03->ptr_->_M_dataplus)._M_p;
        iVar8 = (int)this_03->ptr_->_M_string_length;
        field_name = "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName";
        goto LAB_004bee1d;
      }
      break;
    case 0xcb:
      if (cVar11 == 'Z') {
        psVar13 = this_02->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_02,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_02->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar6) {
          return false;
        }
        data = (this_02->ptr_->_M_dataplus)._M_p;
        iVar8 = (int)this_02->ptr_->_M_string_length;
        field_name = 
        "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName";
        goto LAB_004bee1d;
      }
      break;
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xd0:
    case 0xd1:
      break;
    case 0xd2:
      if (cVar11 == -0x6e) {
        psVar13 = this_01->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_01,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_01->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar6) {
          return false;
        }
        data = (this_01->ptr_->_M_dataplus)._M_p;
        iVar8 = (int)this_01->ptr_->_M_string_length;
        field_name = "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName";
        goto LAB_004bee1d;
      }
      break;
    case 0xd3:
      if (cVar11 == -0x66) {
        psVar13 = this_00->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_00->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar6) {
          return false;
        }
        data = (this_00->ptr_->_M_dataplus)._M_p;
        iVar8 = (int)this_00->ptr_->_M_string_length;
        field_name = "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName";
        goto LAB_004bee1d;
      }
      break;
    default:
      if (uVar7 == 0x6e) {
        if (cVar11 == 'q') {
          pdVar4 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
            bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                              (input,(uint64 *)&local_38);
            dVar14 = local_38;
            if (!bVar6) {
              return false;
            }
          }
          else {
            dVar14 = *pdVar4;
            input->buffer_ = (uint8 *)(pdVar4 + 1);
          }
          this->iouthreshold_ = dVar14;
          goto LAB_004bea8a;
        }
      }
      else if ((uVar7 == 0x6f) && (cVar11 == 'y')) {
        pdVar4 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
          bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                            (input,(uint64 *)&local_38);
          dVar14 = local_38;
          if (!bVar6) {
            return false;
          }
        }
        else {
          dVar14 = *pdVar4;
          input->buffer_ = (uint8 *)(pdVar4 + 1);
        }
        this->confidencethreshold_ = dVar14;
        goto LAB_004bea8a;
      }
    }
  }
switchD_004beb36_caseD_cc:
  if (uVar9 == 0) {
    return true;
  }
  if ((uVar9 & 7) == 4) {
    return true;
  }
  bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar9);
LAB_004beb08:
  if (bVar6 == false) {
    return false;
  }
  goto LAB_004bea8a;
}

Assistant:

bool NonMaximumSuppression::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NonMaximumSuppression)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_picktop()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double iouThreshold = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(881u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &iouthreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double confidenceThreshold = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(889u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &confidencethreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string confidenceInputFeatureName = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_confidenceinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->confidenceinputfeaturename().data(), this->confidenceinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string coordinatesInputFeatureName = 201;
      case 201: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1610u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_coordinatesinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->coordinatesinputfeaturename().data(), this->coordinatesinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string iouThresholdInputFeatureName = 202;
      case 202: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1618u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_iouthresholdinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->iouthresholdinputfeaturename().data(), this->iouthresholdinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string confidenceThresholdInputFeatureName = 203;
      case 203: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1626u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_confidencethresholdinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->confidencethresholdinputfeaturename().data(), this->confidencethresholdinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string confidenceOutputFeatureName = 210;
      case 210: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1682u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_confidenceoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->confidenceoutputfeaturename().data(), this->confidenceoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string coordinatesOutputFeatureName = 211;
      case 211: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1690u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_coordinatesoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->coordinatesoutputfeaturename().data(), this->coordinatesoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NonMaximumSuppression)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NonMaximumSuppression)
  return false;
#undef DO_
}